

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagCode.cpp
# Opt level: O1

span<const_slang::DiagCode,_18446744073709551615UL> slang::findDiagsFromOptionName(string_view name)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint64_t uVar11;
  pointer pDVar12;
  uint uVar13;
  __extent_storage<18446744073709551615UL> _Var14;
  char *in_RSI;
  ulong uVar15;
  long lVar16;
  size_t in_RDI;
  ulong uVar17;
  basic_string_view<char,_std::char_traits<char>_> *pbVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  span<const_slang::DiagCode,_18446744073709551615UL> sVar21;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = in_RDI;
  local_40._M_str = in_RSI;
  uVar11 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &optionMap,&local_40);
  lVar9 = DAT_005ee6f0;
  lVar8 = DAT_005ee6e8;
  uVar7 = DAT_005ee6e0;
  uVar15 = uVar11 >> (optionMap & 0x3f);
  lVar16 = (uVar11 & 0xff) * 4;
  cVar3 = (&UNK_0047c76c)[lVar16];
  cVar4 = (&UNK_0047c76d)[lVar16];
  cVar5 = (&UNK_0047c76e)[lVar16];
  cVar6 = (&UNK_0047c76f)[lVar16];
  uVar17 = 0;
  do {
    pcVar1 = (char *)(lVar8 + uVar15 * 0x10);
    auVar20[0] = -(*pcVar1 == cVar3);
    auVar20[1] = -(pcVar1[1] == cVar4);
    auVar20[2] = -(pcVar1[2] == cVar5);
    auVar20[3] = -(pcVar1[3] == cVar6);
    auVar20[4] = -(pcVar1[4] == cVar3);
    auVar20[5] = -(pcVar1[5] == cVar4);
    auVar20[6] = -(pcVar1[6] == cVar5);
    auVar20[7] = -(pcVar1[7] == cVar6);
    auVar20[8] = -(pcVar1[8] == cVar3);
    auVar20[9] = -(pcVar1[9] == cVar4);
    auVar20[10] = -(pcVar1[10] == cVar5);
    auVar20[0xb] = -(pcVar1[0xb] == cVar6);
    auVar20[0xc] = -(pcVar1[0xc] == cVar3);
    auVar20[0xd] = -(pcVar1[0xd] == cVar4);
    auVar20[0xe] = -(pcVar1[0xe] == cVar5);
    auVar20[0xf] = -(pcVar1[0xf] == cVar6);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      lVar16 = lVar9 + uVar15 * 600;
      do {
        uVar2 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        bVar19 = local_40._M_len == *(size_t *)(lVar16 + (ulong)uVar2 * 0x28);
        pbVar18 = (basic_string_view<char,_std::char_traits<char>_> *)(lVar16 + (ulong)uVar2 * 0x28)
        ;
        if (bVar19 && local_40._M_len != 0) {
          iVar10 = bcmp(local_40._M_str,pbVar18->_M_str,local_40._M_len);
          bVar19 = iVar10 == 0;
        }
        if (bVar19) goto LAB_001499df;
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
      pbVar18 = &local_40;
      if (bVar19) goto LAB_001499df;
    }
    if ((*(byte *)(uVar15 * 0x10 + lVar8 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
    lVar16 = uVar15 + uVar17;
    uVar17 = uVar17 + 1;
    uVar15 = lVar16 + 1U & uVar7;
  } while (uVar17 <= uVar7);
  pbVar18 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_001499df:
  if (pbVar18 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    _Var14._M_extent_value = 0;
    pDVar12 = (pointer)0x0;
  }
  else {
    pDVar12 = (pointer)pbVar18[1]._M_len;
    _Var14._M_extent_value = (long)pbVar18[1]._M_str - (long)pDVar12 >> 2;
  }
  sVar21._M_extent._M_extent_value = _Var14._M_extent_value;
  sVar21._M_ptr = pDVar12;
  return sVar21;
}

Assistant:

std::span<const DiagCode> findDiagsFromOptionName(std::string_view name) {
    if (auto it = optionMap.find(name); it != optionMap.end())
        return it->second;
    return {};
}